

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# search.hpp
# Opt level: O0

void Search::iterative_deepening(position *p,U16 depth,bool silent)

{
  bool bVar1;
  U16 UVar2;
  short *psVar3;
  node *local_10b8;
  Move *local_1050;
  node *local_1030;
  U16 local_1026;
  Score local_1024;
  Score local_1020;
  U16 local_101a;
  Score local_1018;
  Score local_1014;
  Rootmove *local_1010;
  __normal_iterator<Rootmove_*,_std::vector<Rootmove,_std::allocator<Rootmove>_>_> local_1008;
  short local_ffe;
  short local_ffc [3];
  short local_ff6;
  short local_ff4 [3];
  byte local_fee;
  byte local_fed;
  uint local_fec;
  bool failHigh;
  bool failLow;
  uint id;
  Move pv [68];
  undefined1 local_f08 [8];
  node stack [68];
  Score local_20;
  uint stack_size;
  Score eval;
  int16 smallDelta;
  int16 delta;
  int16 beta;
  int16 alpha;
  bool silent_local;
  U16 depth_local;
  position *p_local;
  
  eval._2_2_ = 0xd8f0;
  eval._0_2_ = inf;
  stack_size._2_2_ = 0x41;
  stack_size._0_2_ = 0x21;
  local_20 = ninf;
  delta = depth;
  if (0 < (p->params).fixed_depth) {
    delta = (int16)(p->params).fixed_depth;
  }
  stack[0x43].static_eval = 0x44;
  local_1030 = (node *)local_f08;
  smallDelta._1_1_ = silent;
  _beta = p;
  do {
    node::node(local_1030);
    local_1030 = local_1030 + 1;
  } while (local_1030 != (node *)&stack[0x43].killers[2].type);
  local_1050 = (Move *)&stack0xfffffffffffff018;
  do {
    Move::Move(local_1050);
    local_1050 = local_1050 + 1;
  } while (local_1050 != (Move *)&pv[0x41].t);
  stack[2]._8_8_ = &stack0xfffffffffffff018;
  UVar2 = position::id(_beta);
  local_fec = (uint)UVar2;
  do {
    do {
      local_fec = local_fec + 1;
      if (((ushort)delta < local_fec) || ((UCI_SIGNALS.stop & 1U) != 0)) goto LAB_0015f121;
      stack[1].killers[2].type = '\0';
      stack[1].killers[3].f = '\0';
      stack[0].killers[2].type = '\0';
      stack[0].killers[3].f = '\0';
      local_f08._0_2_ = 0;
      local_fed = 0;
      local_fee = 0;
      hashHits = 0;
      while( true ) {
        if (1 < local_fec) {
          local_ff4[2] = (short)local_20 - (short)stack_size;
          local_ff4[1] = 0xd8f0;
          psVar3 = std::max<short>(local_ff4 + 2,local_ff4 + 1);
          eval._2_2_ = *psVar3;
          local_ff4[0] = (short)local_20 + (short)stack_size;
          local_ff6 = 10000;
          psVar3 = std::min<short>(local_ff4,&local_ff6);
          eval._0_2_ = *psVar3;
          if ((local_fed & 1) != 0) {
            local_ffc[2] = (undefined2)eval + stack_size._2_2_;
            local_ffc[1] = 10000;
            psVar3 = std::min<short>(local_ffc + 2,local_ffc + 1);
            eval._0_2_ = *psVar3;
            local_fed = 0;
          }
          if ((local_fee & 1) != 0) {
            local_ffc[0] = eval._2_2_ - stack_size._2_2_;
            local_ffe = -10000;
            psVar3 = std::max<short>(local_ffc,&local_ffe);
            eval._2_2_ = *psVar3;
            local_fee = 0;
          }
        }
        selDepth = 0;
        local_20 = search<(Nodetype)0>(_beta,eval._2_2_,(undefined2)eval,(U16)local_fec,
                                       (node *)&stack[1].killers[2].type);
        local_1008._M_current =
             (Rootmove *)std::vector<Rootmove,_std::allocator<Rootmove>_>::begin(&_beta->root_moves)
        ;
        local_1010 = (Rootmove *)
                     std::vector<Rootmove,_std::allocator<Rootmove>_>::end(&_beta->root_moves);
        std::
        stable_sort<__gnu_cxx::__normal_iterator<Rootmove*,std::vector<Rootmove,std::allocator<Rootmove>>>>
                  (local_1008,
                   (__normal_iterator<Rootmove_*,_std::vector<Rootmove,_std::allocator<Rootmove>_>_>
                   )local_1010);
        if ((UCI_SIGNALS.stop & 1U) != 0) break;
        if ((local_20 <= (short)eval._2_2_) || ((short)(undefined2)eval <= local_20)) {
          local_1014 = (Score)(short)eval._2_2_;
          local_1018 = (Score)(short)(undefined2)eval;
          local_101a = (U16)local_fec;
          readout_pv((node *)local_f08,&_beta->root_moves,&local_20,&local_1014,&local_1018,
                     &local_101a);
        }
        if ((short)eval._2_2_ < local_20) {
          if (local_20 < (short)(undefined2)eval) break;
          local_fed = 1;
        }
        else {
          local_fee = 1;
        }
        stack_size._2_2_ = stack_size._2_2_ + stack_size._2_2_ / 4;
      }
      bVar1 = main_thread(_beta);
    } while ((!bVar1) || ((UCI_SIGNALS.stop & 1U) != 0));
    if ((smallDelta._1_1_ & 1) == 0) {
      local_1020 = (Score)(short)eval._2_2_;
      local_1024 = (Score)(short)(undefined2)eval;
      local_1026 = (U16)local_fec;
      readout_pv((node *)local_f08,&_beta->root_moves,&local_20,&local_1020,&local_1024,&local_1026)
      ;
    }
  } while (local_fec != (ushort)delta);
  UCI_SIGNALS.stop = true;
LAB_0015f121:
  local_10b8 = (node *)&stack[0x43].killers[2].type;
  do {
    local_10b8 = local_10b8 + -1;
    node::~node(local_10b8);
  } while (local_10b8 != (node *)local_f08);
  return;
}

Assistant:

void Search::iterative_deepening(position& p, U16 depth, bool silent) {
	int16 alpha = ninf;
	int16 beta = inf;
	int16 delta = 65;
	int16 smallDelta = 33;
	Score eval = ninf;


	if (p.params.fixed_depth > 0) {
		depth = p.params.fixed_depth;
	}

	const unsigned stack_size = 64 + 4;
	node stack[stack_size];
	Move pv[Depth::MAX_PLY + 4];

	(stack + 2)->pv = pv;


	// Main iterative deepening loop
	for (unsigned id = 1 + p.id(); id <= depth; ++id) {

		if (UCI_SIGNALS.stop)
			break;

		(stack+0)->ply = (stack + 1)->ply = (stack + 2)->ply = 0;

		auto failLow = false;
		auto failHigh = false;
		hashHits = 0;

		// 1. aspiration window search
		while (true) {
			if (id >= 2) {
				alpha = std::max(int16(eval - smallDelta), int16(ninf));
				beta = std::min(int16(eval + smallDelta), int16(inf));
				if (failLow) {
					beta = std::min(int16(beta + delta), int16(inf));
					failLow = false;
				}
				if (failHigh) {
					alpha = std::max(int16(alpha - delta), int16(ninf));
					failHigh = false;
				}
			}

			selDepth = 0;
			eval = search<root>(p, alpha, beta, id, stack + 2);

			// bring the best move to the front of the root move array
			std::stable_sort(p.root_moves.begin(), p.root_moves.end());


			if (UCI_SIGNALS.stop)
				break;

			if ((eval <= alpha || eval >= beta))
				readout_pv(stack, p.root_moves, eval, Score(alpha), Score(beta), id);

			if (eval <= alpha) {
				delta += delta / 4;
				failHigh = true;
			}
			else if (eval >= beta) {
				delta += delta / 4;
				failLow = true;
			}
			else break;
		}


		// 2. Print PV to UI
		if (main_thread(p) && !UCI_SIGNALS.stop) {

			if (!silent)
				readout_pv(stack, p.root_moves, eval, Score(alpha), Score(beta), id);

			if (id == depth) {
				UCI_SIGNALS.stop = true;
				break;
			}
		}
	}
}